

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collections.cpp
# Opt level: O0

int Lodtalk::IdentityDictionary::stPutAssociation(InterpreterProxy *interpreter)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Oop assoc;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  IdentityDictionary *self;
  Oop association;
  Oop selfOop;
  InterpreterProxy *interpreter_local;
  undefined4 extraout_var_01;
  
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar1) == 1) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0xb])();
    assoc.field_0._0_4_ = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
    assoc.field_0.uintValue._4_4_ = extraout_var_01;
    iVar2 = (**interpreter->_vptr_InterpreterProxy)();
    putAssociation((IdentityDictionary *)CONCAT44(extraout_var_00,iVar1),
                   (VMContext *)CONCAT44(extraout_var_02,iVar2),assoc);
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
    interpreter_local._4_4_ =
         (*interpreter->_vptr_InterpreterProxy[0x17])(interpreter,CONCAT44(extraout_var_03,iVar1));
  }
  else {
    interpreter_local._4_4_ = (*interpreter->_vptr_InterpreterProxy[0x1e])();
  }
  return interpreter_local._4_4_;
}

Assistant:

int IdentityDictionary::stPutAssociation(InterpreterProxy *interpreter)
{
    if(interpreter->getArgumentCount() != 1)
        return interpreter->primitiveFailed();

    Oop selfOop = interpreter->getReceiver();
    Oop association = interpreter->getTemporary(0);
    auto self = reinterpret_cast<IdentityDictionary*> (selfOop.pointer);
    self->putAssociation(interpreter->getContext(), association);
    return interpreter->returnOop(interpreter->getTemporary(0));
}